

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_227985::fillPixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  long lVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  half rgbaValue [4];
  half local_38 [4];
  
  lVar2 = 0;
  for (lVar4 = 0; lVar4 < *pImageHeight; lVar4 = lVar4 + 1) {
    lVar1 = 0;
    for (lVar3 = 0; lVar3 < *pImageWidth; lVar3 = lVar3 + 1) {
      generatePixel((int)lVar4,(int)lVar3,local_38,pIsLeft);
      memcpy((void *)((long)&pPixels->_data->_h + lVar1 + pPixels->_sizeY * lVar2),local_38,
             (ulong)(uint)pNbChannels * 2);
      lVar1 = lVar1 + (long)pNbChannels * 2;
    }
    lVar2 = lVar2 + 2;
  }
  return;
}

Assistant:

void
fillPixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            half rgbaValue[4];

            generatePixel (i, j, &rgbaValue[0], pIsLeft);
            memcpy (
                (void*) &pPixels[i][j * pNbChannels],
                &rgbaValue[0],
                pNbChannels * sizeof (half));
        }
    }
}